

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<tinyusdz::Payload> *value)

{
  bool bVar1;
  undefined1 local_148 [8];
  Payload v;
  optional<tinyusdz::Payload> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::Payload>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    Payload::Payload((Payload *)local_148);
    this_local._7_1_ = ReadBasicType(this,(Payload *)local_148);
    if (this_local._7_1_) {
      nonstd::optional_lite::optional<tinyusdz::Payload>::operator=(value,(Payload *)local_148);
    }
    Payload::~Payload((Payload *)local_148);
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<Payload> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  Payload v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}